

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_stringbuilder.cpp
# Opt level: O2

int32_t __thiscall
icu_63::number::impl::NumberStringBuilder::prepareForInsertHelper
          (NumberStringBuilder *this,int32_t index,int32_t count,UErrorCode *status)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  char16_t *pcVar6;
  UNumberFormatFields *pUVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  ValueOrHeapArray<UNumberFormatFields> *buffer;
  ValueOrHeapArray<char16_t> *buffer_00;
  bool bVar11;
  
  bVar11 = this->fUsingHeap != false;
  iVar10 = 0x28;
  if (bVar11) {
    iVar10 = (this->fChars).heap.capacity;
  }
  lVar4 = (long)this->fZero;
  buffer_00 = &this->fChars;
  if (bVar11) {
    buffer_00 = (ValueOrHeapArray<char16_t> *)(this->fChars).heap.ptr;
  }
  buffer = &this->fFields;
  if (bVar11) {
    buffer = (ValueOrHeapArray<UNumberFormatFields> *)(this->fFields).heap.ptr;
  }
  iVar3 = this->fLength;
  lVar5 = (long)count;
  uVar1 = iVar3 + lVar5;
  iVar9 = (int)uVar1;
  iVar2 = (int)((long)((ulong)(uint)(iVar9 >> 0x1f) << 0x20 | uVar1 & 0xffffffff) / -2);
  if (iVar10 < iVar9) {
    pcVar6 = (char16_t *)uprv_malloc_63(uVar1 * 4);
    pUVar7 = (UNumberFormatFields *)uprv_malloc_63(uVar1 * 8);
    if (pUVar7 == (UNumberFormatFields *)0x0 || pcVar6 == (char16_t *)0x0) {
      uprv_free_63(pcVar6);
      uprv_free_63(pUVar7);
      *status = U_MEMORY_ALLOCATION_ERROR;
      return -1;
    }
    iVar2 = iVar2 + iVar9;
    lVar8 = (long)index;
    if (index != 0) {
      memcpy(pcVar6 + iVar2,buffer_00->value + lVar4,lVar8 * 2);
    }
    iVar10 = this->fLength;
    iVar3 = iVar10 - index;
    if (iVar3 != 0) {
      memcpy(pcVar6 + iVar2 + lVar8 + lVar5,buffer_00->value + lVar4 + lVar8,(long)iVar3 * 2);
    }
    if (index != 0) {
      memcpy(pUVar7 + iVar2,buffer->value + lVar4,lVar8 * 4);
    }
    if (iVar10 != index) {
      memcpy(pUVar7 + iVar2 + lVar8 + lVar5,buffer->value + lVar4 + lVar8,(long)iVar3 << 2);
    }
    if (this->fUsingHeap == true) {
      uprv_free_63(buffer_00);
      uprv_free_63(buffer);
    }
    this->fUsingHeap = true;
    (this->fChars).heap.ptr = pcVar6;
    (this->fChars).heap.capacity = iVar9 * 2;
    (this->fFields).heap.ptr = pUVar7;
    (this->fFields).value[2] = iVar9 * 2;
  }
  else {
    iVar2 = iVar2 + iVar10 / 2;
    pcVar6 = buffer_00->value + iVar2;
    if (iVar3 == 0) {
      iVar10 = 0;
    }
    else {
      memmove(pcVar6,(void *)(lVar4 * 2 + (long)buffer_00),(long)iVar3 * 2);
      iVar10 = this->fLength;
    }
    iVar3 = index;
    if (iVar10 - index != 0) {
      memmove(pcVar6 + index + lVar5,pcVar6 + index,(long)(iVar10 - index) * 2);
      iVar3 = this->fLength;
    }
    pUVar7 = buffer->value + iVar2;
    if (iVar3 == 0) {
      iVar10 = 0;
    }
    else {
      memmove(pUVar7,(void *)((long)buffer + lVar4 * 4),(long)iVar3 << 2);
      iVar10 = this->fLength;
    }
    if (iVar10 - index != 0) {
      memmove(pUVar7 + index + lVar5,pUVar7 + index,(long)(iVar10 - index) << 2);
    }
  }
  this->fZero = iVar2;
  this->fLength = this->fLength + count;
  return index + iVar2;
}

Assistant:

int32_t NumberStringBuilder::prepareForInsertHelper(int32_t index, int32_t count, UErrorCode &status) {
    int32_t oldCapacity = getCapacity();
    int32_t oldZero = fZero;
    char16_t *oldChars = getCharPtr();
    Field *oldFields = getFieldPtr();
    if (fLength + count > oldCapacity) {
        int32_t newCapacity = (fLength + count) * 2;
        int32_t newZero = newCapacity / 2 - (fLength + count) / 2;

        // C++ note: malloc appears in two places: here and in the assignment operator.
        auto newChars = static_cast<char16_t *> (uprv_malloc(sizeof(char16_t) * newCapacity));
        auto newFields = static_cast<Field *>(uprv_malloc(sizeof(Field) * newCapacity));
        if (newChars == nullptr || newFields == nullptr) {
            uprv_free(newChars);
            uprv_free(newFields);
            status = U_MEMORY_ALLOCATION_ERROR;
            return -1;
        }

        // First copy the prefix and then the suffix, leaving room for the new chars that the
        // caller wants to insert.
        // C++ note: memcpy is OK because the src and dest do not overlap.
        uprv_memcpy2(newChars + newZero, oldChars + oldZero, sizeof(char16_t) * index);
        uprv_memcpy2(newChars + newZero + index + count,
                oldChars + oldZero + index,
                sizeof(char16_t) * (fLength - index));
        uprv_memcpy2(newFields + newZero, oldFields + oldZero, sizeof(Field) * index);
        uprv_memcpy2(newFields + newZero + index + count,
                oldFields + oldZero + index,
                sizeof(Field) * (fLength - index));

        if (fUsingHeap) {
            uprv_free(oldChars);
            uprv_free(oldFields);
        }
        fUsingHeap = true;
        fChars.heap.ptr = newChars;
        fChars.heap.capacity = newCapacity;
        fFields.heap.ptr = newFields;
        fFields.heap.capacity = newCapacity;
        fZero = newZero;
        fLength += count;
    } else {
        int32_t newZero = oldCapacity / 2 - (fLength + count) / 2;

        // C++ note: memmove is required because src and dest may overlap.
        // First copy the entire string to the location of the prefix, and then move the suffix
        // to make room for the new chars that the caller wants to insert.
        uprv_memmove2(oldChars + newZero, oldChars + oldZero, sizeof(char16_t) * fLength);
        uprv_memmove2(oldChars + newZero + index + count,
                oldChars + newZero + index,
                sizeof(char16_t) * (fLength - index));
        uprv_memmove2(oldFields + newZero, oldFields + oldZero, sizeof(Field) * fLength);
        uprv_memmove2(oldFields + newZero + index + count,
                oldFields + newZero + index,
                sizeof(Field) * (fLength - index));

        fZero = newZero;
        fLength += count;
    }
    return fZero + index;
}